

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrate.c
# Opt level: O3

void xc_rdqagse(integr_fn *f,void *ex,double *a,double *b,double *epsabs,double *epsrel,int *limit,
               double *result,double *abserr,int *neval,int *ier,double *alist__,double *blist,
               double *rlist,double *elist,int *iord,int *last)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int iVar5;
  bool bVar6;
  integr_fn *f_00;
  void *ex_00;
  int iVar7;
  int iVar8;
  long lVar9;
  int *piVar10;
  int iVar11;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  int iVar16;
  long lVar17;
  long lVar18;
  double *pdVar19;
  uint uVar20;
  long lVar21;
  int iVar22;
  ulong uVar23;
  bool bVar24;
  ulong uVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  double dVar29;
  double dVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  double dVar42;
  undefined1 auVar41 [16];
  double dVar43;
  double dVar44;
  double resabs;
  double error2;
  double error1;
  double defab2;
  double defab1;
  double area2;
  double area1;
  double defabs;
  double rlist2 [52];
  double *in_stack_fffffffffffffc78;
  undefined4 in_stack_fffffffffffffc80;
  int iVar45;
  undefined4 in_stack_fffffffffffffc84;
  int iVar46;
  int local_36c;
  int local_34c;
  undefined1 local_348 [48];
  undefined1 local_318 [16];
  double local_2f0;
  double local_2e8;
  undefined8 uStack_2e0;
  double local_2d8;
  undefined8 uStack_2d0;
  undefined1 local_2c8 [16];
  double local_2b8;
  undefined8 uStack_2b0;
  double local_2a8;
  double dStack_2a0;
  double local_298;
  undefined8 uStack_290;
  double local_288;
  undefined8 uStack_280;
  double local_270;
  double *local_268;
  double *local_260;
  integr_fn *local_258;
  void *local_250;
  double local_248;
  double local_240;
  double local_238;
  double local_230;
  double local_228;
  double local_220 [5];
  double local_1f8;
  undefined8 auStack_1f0 [2];
  double local_1e0 [54];
  
  *ier = 0;
  *neval = 0;
  *last = 0;
  *result = 0.0;
  *abserr = 0.0;
  *alist__ = *a;
  *blist = *b;
  *rlist = 0.0;
  *elist = 0.0;
  if ((*epsabs <= 0.0) && (*epsrel <= 1.1102230246251565e-14 && *epsrel != 1.1102230246251565e-14))
  {
    *ier = 6;
    return;
  }
  local_268 = a;
  local_260 = b;
  local_258 = f;
  local_250 = ex;
  rdqk21(f,ex,result,abserr,local_1e0,&local_2f0,in_stack_fffffffffffffc78,
         (double *)CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80));
  dVar1 = *result;
  local_2b8 = ABS(dVar1);
  dVar30 = *epsrel * local_2b8;
  if (*epsrel * local_2b8 <= *epsabs) {
    dVar30 = *epsabs;
  }
  iVar46 = 1;
  *last = 1;
  *rlist = dVar1;
  local_2a8 = *abserr;
  *elist = local_2a8;
  *iord = 1;
  if ((local_2a8 <= local_1e0[0] * 2.220446049250313e-14) && (dVar30 < local_2a8)) {
    *ier = 2;
  }
  if (*limit == 1) {
LAB_006c3a4b:
    *ier = iVar46;
    goto LAB_006c3a56;
  }
  if ((*ier != 0) ||
     (((local_2a8 == 0.0 && (!NAN(local_2a8))) || (local_2f0 != local_2a8 && local_2a8 <= dVar30))))
  goto LAB_006c3a56;
  dStack_2a0 = *result;
  *abserr = 1.79769313486232e+308;
  *last = 2;
  if (1 < *limit) {
    local_270 = local_1e0[0] * 0.9999999999999889;
    uVar26 = SUB84(local_2a8,0);
    uVar27 = (undefined4)((ulong)local_2a8 >> 0x20);
    uVar13 = 2;
    uVar15 = 1;
    bVar24 = false;
    local_318 = ZEXT816(0);
    iVar45 = 0;
    local_34c = 0;
    iVar16 = 0;
    iVar11 = 0;
    local_36c = 0;
    iVar46 = 0;
    iVar8 = 0;
    uVar23 = 1;
    local_2c8 = ZEXT816(0);
    local_348._0_16_ = ZEXT816(0);
    local_2e8 = 0.0;
    uStack_2e0 = 0;
    uStack_2b0 = 0;
    local_1e0[1] = dStack_2a0;
LAB_006c3bb0:
    ex_00 = local_250;
    f_00 = local_258;
    local_1f8 = (double)CONCAT44(uVar27,uVar26);
    auStack_1f0[0] = 0;
    iVar22 = (int)uVar23;
    local_298 = alist__[(long)iVar22 + -1];
    local_288 = blist[(long)iVar22 + -1];
    uStack_280 = 0;
    local_2d8 = (local_298 + local_288) * 0.5;
    uStack_2d0 = 0;
    uStack_290 = 0;
    rdqk21(local_258,local_250,local_220,&local_240,&local_2f0,&local_230,in_stack_fffffffffffffc78,
           (double *)CONCAT44(iVar46,iVar45));
    rdqk21(f_00,ex_00,&local_228,&local_248,&local_2f0,&local_238,in_stack_fffffffffffffc78,
           (double *)CONCAT44(iVar46,iVar45));
    uVar26 = SUB84(local_240,0);
    uVar27 = (undefined4)((ulong)local_240 >> 0x20);
    dVar1 = local_248 + local_240;
    dVar30 = local_228 + local_220[0];
    if ((local_230 != local_240) || (NAN(local_230) || NAN(local_240))) {
      if ((local_238 == local_248) && (!NAN(local_238) && !NAN(local_248))) goto LAB_006c3dbb;
      if ((ABS(rlist[(long)iVar22 + -1] - dVar30) <= ABS(dVar30) * 1e-05) &&
         (local_1f8 * 0.99 <= dVar1)) {
        iVar16 = iVar16 + (uint)(iVar45 != 0);
        iVar11 = iVar11 + (uint)(iVar45 == 0);
      }
      iVar7 = *last;
      local_34c = local_34c + (uint)(local_1f8 < dVar1 && 10 < iVar7);
    }
    else {
LAB_006c3dbb:
      iVar7 = *last;
    }
    local_2a8 = (local_2a8 + dVar1) - local_1f8;
    dStack_2a0 = (dStack_2a0 + dVar30) - rlist[(long)iVar22 + -1];
    rlist[(long)iVar22 + -1] = local_220[0];
    rlist[(long)iVar7 + -1] = local_228;
    dVar29 = ABS(dStack_2a0) * *epsrel;
    if (ABS(dStack_2a0) * *epsrel <= *epsabs) {
      dVar29 = *epsabs;
    }
    if ((9 < iVar11 + iVar16) || (0x13 < local_34c)) {
      *ier = 2;
      iVar7 = *last;
    }
    if (4 < iVar16) {
      iVar46 = 3;
    }
    dVar38 = ABS(local_288);
    if (ABS(local_288) <= ABS(local_298)) {
      dVar38 = ABS(local_298);
    }
    dVar36 = (ABS(local_2d8) + 2.2250738585072014e-305) * 1.0000000000000222;
    if ((dVar38 <= dVar36) || (iVar7 == *limit)) {
      *ier = (uint)(dVar38 <= dVar36) * 3 + 1;
    }
    if (local_248 <= local_240) {
      iVar7 = *last;
      lVar9 = (long)iVar7;
      alist__[lVar9 + -1] = local_2d8;
      blist[(long)iVar22 + -1] = local_2d8;
      blist[lVar9 + -1] = local_288;
      uVar26 = SUB84(local_248,0);
      uVar27 = (undefined4)((ulong)local_248 >> 0x20);
      dVar38 = local_240;
    }
    else {
      alist__[(long)iVar22 + -1] = local_2d8;
      iVar7 = *last;
      lVar9 = (long)iVar7;
      alist__[lVar9 + -1] = local_298;
      blist[lVar9 + -1] = local_2d8;
      rlist[(long)iVar22 + -1] = local_228;
      rlist[lVar9 + -1] = local_220[0];
      dVar38 = local_248;
    }
    elist[(long)iVar22 + -1] = dVar38;
    elist[lVar9 + -1] = (double)CONCAT44(uVar27,uVar26);
    if (iVar7 < 3) {
      iord[0] = 1;
      iord[1] = 2;
    }
    else {
      dVar38 = elist[(long)iVar22 + -1];
      if (1 < (int)uVar15) {
        piVar10 = iord + ((uVar15 & 0xffffffff) - 1);
        do {
          if (dVar38 <= elist[(long)piVar10[-1] + -1]) goto LAB_006c406f;
          *piVar10 = piVar10[-1];
          uVar14 = (int)uVar15 - 1;
          uVar15 = (ulong)uVar14;
          piVar10 = piVar10 + -1;
        } while (uVar14 != 1);
        uVar15 = 1;
LAB_006c406f:
        iVar7 = *last;
      }
      iVar5 = (*limit - iVar7) + 3;
      if (iVar7 <= *limit / 2 + 2) {
        iVar5 = iVar7;
      }
      lVar9 = (long)iVar5;
      if ((int)uVar15 < iVar5 + -1) {
        dVar36 = elist[(long)iVar7 + -1];
        lVar17 = (long)(int)uVar15;
        lVar21 = (uVar15 & 0xffffffff) << 0x20;
        lVar18 = 1;
        do {
          if (elist[(long)iord[lVar17 + lVar18 + -1] + -1] <= dVar38) {
            uVar23 = (uVar15 & 0xffffffff) + lVar18;
            *(int *)((long)iord + (lVar21 >> 0x1e) + -4) = iVar22;
            if (iVar5 <= (int)uVar23) goto LAB_006c41b8;
            piVar10 = iord + lVar9 + -1;
            goto LAB_006c4190;
          }
          iord[lVar17 + lVar18 + -2] = iord[lVar17 + lVar18 + -1];
          lVar18 = lVar18 + 1;
          lVar21 = lVar21 + 0x100000000;
        } while (lVar9 - lVar17 != lVar18);
      }
      iord[(long)(iVar5 + -1) + -1] = iVar22;
      iord[lVar9 + -1] = *last;
      uVar15 = uVar15 & 0xffffffff;
    }
    goto LAB_006c41ce;
  }
  *result = 0.0;
  uVar14 = 2;
LAB_006c4865:
  dVar1 = 0.0;
  uVar13 = 0;
  do {
    dVar1 = dVar1 + rlist[uVar13];
    *result = dVar1;
    uVar13 = uVar13 + 1;
  } while (uVar14 != uVar13);
LAB_006c4880:
  *abserr = local_2a8;
  iVar16 = *ier;
  goto LAB_006c4890;
  while( true ) {
    *piVar10 = piVar10[-1];
    uVar14 = (int)uVar23 + 1;
    uVar23 = (ulong)uVar14;
    piVar10 = piVar10 + -1;
    if (iVar5 <= (int)uVar14) break;
LAB_006c4190:
    if (dVar36 < elist[(long)piVar10[-1] + -1]) {
      *piVar10 = *last;
      goto LAB_006c41c6;
    }
  }
LAB_006c41b8:
  iord[lVar17 + lVar18 + -1] = *last;
LAB_006c41c6:
  uVar15 = uVar15 & 0xffffffff;
LAB_006c41ce:
  if (local_2a8 <= dVar29) goto LAB_006c4857;
  if (*ier != 0) goto LAB_006c4828;
  iVar7 = (int)uVar15;
  uVar14 = iord[(long)iVar7 + -1];
  uVar23 = (ulong)uVar14;
  uVar26 = SUB84(elist[(long)(int)uVar14 + -1],0);
  uVar27 = (undefined4)((ulong)elist[(long)(int)uVar14 + -1] >> 0x20);
  iVar22 = *last;
  if (iVar22 == 2) {
    local_318._8_8_ = 0;
    local_318._0_8_ = ABS(*local_260 - *local_268) * 0.375;
    iVar22 = 2;
    local_348._8_8_ = dStack_2a0;
    local_348._0_8_ = local_2a8;
    local_2c8._8_8_ = ABS(dStack_2a0);
    local_2c8._0_8_ = dVar29;
    local_1e0[2] = dStack_2a0;
  }
  else if (bVar24) {
    bVar24 = true;
  }
  else {
    uVar25 = -(ulong)((double)local_318._0_8_ < ABS(local_2d8 - local_298));
    auVar40._0_8_ = ~uVar25 & (ulong)((double)local_348._0_8_ - local_1f8);
    auVar40._8_8_ = ~local_318._8_8_ & local_348._8_8_;
    auVar32._8_4_ = (int)((ulong)dVar30 & local_318._8_8_);
    auVar32._0_8_ = (ulong)(dVar1 + ((double)local_348._0_8_ - local_1f8)) & uVar25;
    auVar32._12_4_ = (int)(((ulong)dVar30 & local_318._8_8_) >> 0x20);
    local_348._0_16_ = auVar40 | auVar32;
    if (iVar45 == 0) {
      iVar7 = 2;
      iVar45 = 0;
      if ((double)local_318._0_8_ <
          ABS(blist[(long)(int)uVar14 + -1] - alist__[(long)(int)uVar14 + -1])) {
        bVar24 = false;
        goto LAB_006c480d;
      }
    }
    if ((iVar46 != 3) && ((double)local_2c8._0_8_ < (double)local_348._0_8_)) {
      iVar45 = (*limit - iVar22) + 3;
      if (iVar22 <= *limit / 2 + 2) {
        iVar45 = iVar22;
      }
      if (iVar7 <= iVar45) {
        uVar15 = (ulong)iVar7;
        iVar7 = iVar7 + -1;
        do {
          uVar14 = iord[uVar15 - 1];
          uVar23 = (ulong)uVar14;
          if ((double)local_318._0_8_ <
              ABS(blist[(long)(int)uVar14 + -1] - alist__[(long)(int)uVar14 + -1])) {
            uVar26 = SUB84(elist[(long)(int)uVar14 + -1],0);
            uVar27 = (undefined4)((ulong)elist[(long)(int)uVar14 + -1] >> 0x20);
            bVar24 = false;
            iVar45 = 1;
            goto LAB_006c480d;
          }
          uVar15 = uVar15 + 1;
          iVar7 = iVar7 + 1;
        } while (iVar7 < iVar45);
      }
    }
    uVar14 = (uint)uVar13;
    uVar12 = uVar14 + 1;
    uVar25 = (ulong)uVar12;
    local_1e0[(long)(int)uVar14 + 1] = dStack_2a0;
    if ((int)uVar14 < 2) {
      dVar36 = 1.79769313486232e+308;
      dVar29 = dStack_2a0;
      dVar38 = dStack_2a0;
    }
    else {
      local_1e0[(ulong)uVar12 + 2] = dStack_2a0;
      uVar13 = uVar13 >> 1;
      local_1e0[uVar12] = 1.79769313486232e+308;
      iVar45 = (int)uVar13;
      lVar9 = 0;
      dVar30 = 1.79769313486232e+308;
      uVar26 = SUB84(dStack_2a0,0);
      uVar27 = (undefined4)((ulong)dStack_2a0 >> 0x20);
      piVar10 = neval;
      dVar1 = dStack_2a0;
      do {
        dVar29 = local_1e0[(ulong)uVar12 + lVar9 + 2];
        dVar38 = 0.0;
        auVar32 = *(undefined1 (*) [16])(auStack_1f0 + (ulong)uVar12 + lVar9);
        dVar33 = auVar32._8_8_;
        dVar35 = dVar33 - auVar32._0_8_;
        auVar39._0_8_ = ABS(auVar32._0_8_);
        dVar43 = ABS(dVar33);
        dVar34 = ABS(dVar35);
        dVar36 = ABS(dVar29 - dVar33);
        auVar39._8_8_ = dVar43;
        auVar4._8_8_ = ABS(dVar29);
        auVar4._0_8_ = dVar43;
        auVar40 = maxpd(auVar39,auVar4);
        dVar37 = auVar40._0_8_ * 2.220446049250313e-16;
        dVar42 = auVar40._8_8_ * 2.220446049250313e-16;
        if ((dVar36 <= dVar42) && (dVar34 <= dVar37)) {
          dVar36 = dVar36 + dVar34;
          goto LAB_006c4701;
        }
        dVar38 = local_1e0[(ulong)uVar12 + lVar9];
        local_1e0[(ulong)uVar12 + lVar9] = dVar33;
        dVar44 = ABS(dVar38);
        if (dVar44 <= dVar43) {
          dVar44 = dVar43;
        }
        auVar41._8_8_ = -(ulong)(dVar42 < dVar36);
        auVar41._0_8_ = -(ulong)(dVar37 < dVar34);
        uVar20 = movmskpd((int)piVar10,auVar41);
        piVar10 = (int *)(ulong)uVar20;
        if ((((uVar20 & 2) == 0) ||
            (dVar38 = dVar33 - dVar38, ABS(dVar38) <= dVar44 * 2.220446049250313e-16)) ||
           ((uVar20 & 1) == 0)) {
LAB_006c45cf:
          uVar20 = 1 - (int)lVar9;
          goto LAB_006c45d6;
        }
        auVar3._8_8_ = dVar29 - dVar33;
        auVar3._0_8_ = dVar35;
        auVar40 = divpd(_DAT_01025040,auVar3);
        dVar38 = (auVar40._8_8_ + 1.0 / dVar38) - auVar40._0_8_;
        if (ABS(dVar33 * dVar38) <= 0.0001) goto LAB_006c45cf;
        dVar33 = dVar33 + 1.0 / dVar38;
        local_1e0[(ulong)uVar12 + lVar9] = dVar33;
        dVar34 = ABS(dVar33 - dVar29) + dVar36 + dVar34;
        if (dVar34 <= dVar30) {
          uVar26 = auVar32._8_4_;
          uVar27 = auVar32._12_4_;
          dVar1 = dVar33;
        }
        dVar30 = (double)(-(ulong)(dVar30 < dVar34) & (ulong)dVar30 |
                         ~-(ulong)(dVar30 < dVar34) & (ulong)dVar34);
        lVar9 = lVar9 + -2;
        uVar20 = (int)uVar13 - 1;
        uVar13 = (ulong)uVar20;
      } while (uVar20 != 0);
      uVar20 = uVar12;
      if (uVar12 == 0x32) {
        uVar20 = 0x31;
      }
LAB_006c45d6:
      iVar45 = iVar45 + 1;
      pdVar19 = local_1e0 + (ulong)(uVar14 & 1) + 3;
      do {
        pdVar19[-2] = *pdVar19;
        pdVar19 = pdVar19 + 2;
        iVar45 = iVar45 + -1;
      } while (iVar45 != 0);
      if (0 < (int)uVar20 && uVar12 != uVar20) {
        uVar13 = 0;
        do {
          local_1e0[uVar13 + 1] = local_1e0[((long)(int)uVar12 + uVar13 + 1) - (long)(int)uVar20];
          uVar13 = uVar13 + 1;
        } while (uVar20 != uVar13);
      }
      if (iVar8 < 3) {
        local_220[iVar8 + 1] = dVar1;
        dVar36 = 1.79769313486232e+308;
      }
      else {
        dVar36 = ABS(dVar1 - local_220[1]) + ABS(dVar1 - local_220[3]) + ABS(dVar1 - local_220[2]);
        local_220[1] = local_220[2];
        local_220[2] = local_220[3];
        local_220[3] = dVar1;
      }
      uVar25 = (ulong)uVar20;
      dVar38 = (double)CONCAT44(uVar27,uVar26);
      dVar29 = dVar1;
    }
LAB_006c4701:
    dVar30 = ABS(dVar29) * 1.1102230246251565e-15;
    bVar24 = 4 < local_36c;
    dVar1 = *abserr;
    bVar6 = dVar1 < local_2a8 * 0.001;
    if (bVar6 && bVar24) {
      *ier = 5;
    }
    if (dVar30 <= dVar36) {
      dVar30 = dVar36;
    }
    if (dVar1 <= dVar30) {
      local_36c = local_36c + 1;
      local_348._8_8_ = uStack_2e0;
      local_348._0_8_ = local_2e8;
    }
    else {
      *abserr = dVar30;
      *result = dVar29;
      dVar1 = ABS(dVar29) * *epsrel;
      if (dVar1 <= *epsabs) {
        dVar1 = *epsabs;
      }
      dVar30 = *abserr;
      local_36c = 0;
      local_2c8._8_4_ = SUB84(ABS(dVar38),0);
      local_2c8._0_8_ = dVar1;
      local_2c8._12_4_ = (int)((ulong)ABS(dVar38) >> 0x20);
      if (dVar30 <= dVar1) goto LAB_006c484b;
    }
    if (bVar6 && bVar24) {
      local_2e8 = (double)local_348._0_8_;
      goto LAB_006c4828;
    }
    bVar24 = (int)uVar25 == 1;
    uVar23 = (ulong)*iord;
    uVar26 = SUB84(elist[uVar23 - 1],0);
    uVar27 = (undefined4)((ulong)elist[uVar23 - 1] >> 0x20);
    uVar28 = local_318._12_4_;
    local_318._8_4_ = local_318._8_4_;
    local_318._0_8_ = (double)local_318._0_8_ * 0.5;
    local_318._12_4_ = uVar28;
    iVar22 = *last;
    iVar45 = 0;
    uVar15 = 1;
    local_2e8 = (double)local_348._0_8_;
    uStack_2e0 = local_348._8_8_;
    local_348._8_8_ = dStack_2a0;
    local_348._0_8_ = local_2a8;
    uVar13 = uVar25;
    iVar8 = iVar8 + 1;
  }
LAB_006c480d:
  *last = iVar22 + 1;
  if (*limit <= iVar22) goto LAB_006c4828;
  goto LAB_006c3bb0;
LAB_006c4828:
  dVar30 = *abserr;
  local_348._0_8_ = local_2e8;
LAB_006c484b:
  if ((dVar30 == 1.79769313486232e+308) && (!NAN(dVar30))) goto LAB_006c4857;
  iVar16 = *ier;
  if (iVar16 + iVar46 != 0) {
    if (iVar46 == 3) {
      dVar30 = dVar30 + (double)local_348._0_8_;
      *abserr = dVar30;
    }
    if (iVar16 == 0) {
      *ier = 3;
      iVar16 = 3;
    }
    dVar1 = *result;
    uVar26 = SUB84(dVar1,0);
    uVar27 = (undefined4)((ulong)dVar1 >> 0x20);
    if (((dVar1 == 0.0) && (!NAN(dVar1))) || ((dStack_2a0 == 0.0 && (!NAN(dStack_2a0))))) {
      if (dVar30 <= local_2a8) {
        if ((dStack_2a0 != 0.0) || (NAN(dStack_2a0))) goto LAB_006c48b0;
        goto LAB_006c4890;
      }
    }
    else {
      auVar31._8_8_ = local_2a8;
      auVar31._0_8_ = dVar30;
      auVar2._8_4_ = SUB84(ABS(dStack_2a0),0);
      auVar2._0_8_ = ABS(dVar1);
      auVar2._12_4_ = (int)((ulong)ABS(dStack_2a0) >> 0x20);
      auVar32 = divpd(auVar31,auVar2);
      if (auVar32._0_8_ <= auVar32._8_8_) goto LAB_006c48b0;
    }
LAB_006c4857:
    uVar14 = *last;
    *result = 0.0;
    if (0 < (int)uVar14) goto LAB_006c4865;
    goto LAB_006c4880;
  }
  uVar26 = SUB84(*result,0);
  uVar27 = (undefined4)((ulong)*result >> 0x20);
LAB_006c48b0:
  if (local_2b8 < local_270) {
    dVar1 = ABS(dStack_2a0);
    if (ABS(dStack_2a0) <= ABS((double)CONCAT44(uVar27,uVar26))) {
      dVar1 = ABS((double)CONCAT44(uVar27,uVar26));
    }
    if (dVar1 <= local_1e0[0] * 0.01) goto LAB_006c4890;
  }
  dVar1 = (double)CONCAT44(uVar27,uVar26) / dStack_2a0;
  iVar46 = 5;
  if (((dVar1 < 0.01) || (100.0 < dVar1)) || (ABS(dStack_2a0) < local_2a8)) goto LAB_006c3a4b;
LAB_006c4890:
  if (iVar16 < 3) {
    return;
  }
LAB_006c3a56:
  *neval = *last * 0x2a + -0x15;
  return;
}

Assistant:

GPU_FUNCTION void xc_rdqagse(integr_fn f, void *ex, double *a, double *b,
	     double *epsabs, double *epsrel, int *limit, double *result,
	     double *abserr, int *neval, int *ier, double *alist__,
	     double *blist, double *rlist, double *elist, int *iord, int *last)
{
  /* Local variables */
  int noext, extrap;
  int k,ksgn, nres;
  int ierro;
  int ktmin, nrmax;
  int iroff1, iroff2, iroff3;
  int id;
  int numrl2;
  int jupbnd;
  int maxerr;
  double res3la[3];
  double rlist2[52];
  double abseps, area, area1, area2, area12, dres, epmach;
  double a1, a2, b1, b2, defabs, defab1, defab2, oflow, uflow, resabs, reseps;
  double error1, error2, erro12, errbnd, erlast, errmax, errsum;

  double correc = 0.0, erlarg = 0.0, ertest = 0.0, small = 0.0;
  /*
 ***begin prologue  dqagse
 ***date written   800101   (yymmdd)
 ***revision date  830518   (yymmdd)
 ***category no.  h2a1a1
 ***keywords  automatic integrator, general-purpose,
              (end point) singularities, extrapolation,
              globally adaptive
 ***author  piessens,robert,appl. math. & progr. div. - k.u.leuven
            de doncker,elise,appl. math. & progr. div. - k.u.leuven
 ***purpose  the routine calculates an approximation result to a given
             definite integral i = integral of f over (a,b),
             hopefully satisfying following claim for accuracy
             abs(i-result) <= max(epsabs,epsrel*abs(i)).
 ***description

       computation of a definite integral
       standard fortran subroutine
       double precision version

       parameters
        on entry
           f      - double precision
                    function subprogram defining the integrand
                    function f(x). the actual name for f needs to be
                    declared e x t e r n a l in the driver program.

           a      - double precision
                    lower limit of integration

           b      - double precision
                    upper limit of integration

           epsabs - double precision
                    absolute accuracy requested
           epsrel - double precision
                    relative accuracy requested
                    if  epsabs <= 0
                    and epsrel < max(50*rel.mach.acc.,0.5d-28),
                    the routine will end with ier = 6.

           limit  - int
                    gives an upperbound on the number of subintervals
                    in the partition of (a,b)

        on return
           result - double precision
                    approximation to the integral

           abserr - double precision
                    estimate of the modulus of the absolute error,
                    which should equal or exceed abs(i-result)

           neval  - int
                    number of integrand evaluations

           ier    - int
                    ier = 0 normal and reliable termination of the
                            routine. it is assumed that the requested
                            accuracy has been achieved.
                    ier > 0 abnormal termination of the routine
                            the estimates for integral and error are
                            less reliable. it is assumed that the
                            requested accuracy has not been achieved.
           error messages
                        = 1 maximum number of subdivisions allowed
                            has been achieved. one can allow more sub-
                            divisions by increasing the value of limit
                            (and taking the according dimension
                            adjustments into account). however, if
                            this yields no improvement it is advised
                            to analyze the integrand in order to
                            determine the integration difficulties. if
                            the position of a local difficulty can be
                            determined (e.g. singularity,
                            discontinuity within the interval) one
                            will probably gain from splitting up the
                            interval at this point and calling the
                            integrator on the subranges. if possible,
                            an appropriate special-purpose integrator
                            should be used, which is designed for
                            handling the type of difficulty involved.
                        = 2 the occurrence of roundoff error is detec-
                            ted, which prevents the requested
                            tolerance from being achieved.
                            the error may be under-estimated.
                        = 3 extremely bad integrand behaviour
                            occurs at some points of the integration
                            interval.
                        = 4 the algorithm does not converge.
                            roundoff error is detected in the
                            extrapolation table.
                            it is presumed that the requested
                            tolerance cannot be achieved, and that the
                            returned result is the best which can be
                            obtained.
                        = 5 the integral is probably divergent, or
                            slowly convergent. it must be noted that
                            divergence can occur with any other value
                            of ier.
                        = 6 the input is invalid, because
                            epsabs <= 0 and
                            epsrel < max(50*rel.mach.acc.,0.5d-28).
                            result, abserr, neval, last, rlist(1),
                            iord(1) and elist(1) are set to zero.
                            alist(1) and blist(1) are set to a and b
                            respectively.

           alist  - double precision
                    vector of dimension at least limit, the first
                     last  elements of which are the left end points
                    of the subintervals in the partition of the
                    given integration range (a,b)

           blist  - double precision
                    vector of dimension at least limit, the first
                     last  elements of which are the right end points
                    of the subintervals in the partition of the given
                    integration range (a,b)

           rlist  - double precision
                    vector of dimension at least limit, the first
                     last  elements of which are the integral
                    approximations on the subintervals

           elist  - double precision
                    vector of dimension at least limit, the first
                     last  elements of which are the moduli of the
                    absolute error estimates on the subintervals

           iord   - int
                    vector of dimension at least limit, the first k
                    elements of which are pointers to the
                    error estimates over the subintervals,
                    such that elist(iord(1)), ..., elist(iord(k))
                    form a decreasing sequence, with k = last
                    if last <= (limit/2+2), and k = limit+1-last
                    otherwise

           last   - int
                    number of subintervals actually produced in the
                    subdivision process

 ***references  (none)
 ***routines called  dqelg,dqk21,dqpsrt
 ***end prologue  dqagse



           the dimension of rlist2 is determined by the value of
           limexp in subroutine dqelg (rlist2 should be of dimension
           (limexp+2) at least).

           list of major variables
           -----------------------

          alist     - list of left end points of all subintervals
                      considered up to now
          blist     - list of right end points of all subintervals
                      considered up to now
          rlist(i)  - approximation to the integral over
                      (alist(i),blist(i))
          rlist2    - array of dimension at least limexp+2 containing
                      the part of the epsilon table which is still
                      needed for further computations
          elist(i)  - error estimate applying to rlist(i)
          maxerr    - pointer to the interval with largest error
                      estimate
          errmax    - elist(maxerr)
          erlast    - error on the interval currently subdivided
                      (before that subdivision has taken place)
          area      - sum of the integrals over the subintervals
          errsum    - sum of the errors over the subintervals
          errbnd    - requested accuracy max(epsabs,epsrel*
                      abs(result))
          *****1    - variable for the left interval
          *****2    - variable for the right interval
          last      - index for subdivision
          nres      - number of calls to the extrapolation routine
          numrl2    - number of elements currently in rlist2. if an
                      appropriate approximation to the compounded
                      integral has been obtained it is put in
                      rlist2(numrl2) after numrl2 has been increased
                      by one.
          small     - length of the smallest interval considered up
                      to now, multiplied by 1.5
          erlarg    - sum of the errors over the intervals larger
                      than the smallest interval considered up to now
          extrap    - logical variable denoting that the routine is
                      attempting to perform extrapolation i.e. before
                      subdividing the smallest interval we try to
                      decrease the value of erlarg.
          noext     - logical variable denoting that extrapolation
                      is no longer allowed (true value)

           machine dependent constants
           ---------------------------

          epmach is the largest relative spacing.
          uflow is the smallest positive magnitude.
          oflow is the largest positive magnitude. */

  /* ***first executable statement  dqagse */
  /* Parameter adjustments */
  --iord;
  --elist;
  --rlist;
  --blist;
  --alist__;

  /* Function Body */
  epmach = DBL_EPSILON;

  /*            test on validity of parameters */
  /*            ------------------------------ */
  *ier = 0;
  *neval = 0;
  *last = 0;
  *result = 0.;
  *abserr = 0.;
  alist__[1] = *a;
  blist[1] = *b;
  rlist[1] = 0.;
  elist[1] = 0.;
  if (*epsabs <= 0. && *epsrel < m_max(epmach * 50., 5e-29)) {
    *ier = 6;
    return;
  }

  /*           first approximation to the integral */
  /*           ----------------------------------- */

  uflow = DBL_MIN;
  oflow = DBL_MAX;
  ierro = 0;
  rdqk21(f, ex, a, b, result, abserr, &defabs, &resabs);

  /*           test on accuracy. */

  dres = fabs(*result);
  errbnd = m_max(*epsabs, *epsrel * dres);
  *last = 1;
  rlist[1] = *result;
  elist[1] = *abserr;
  iord[1] = 1;
  if (*abserr <= epmach * 100. * defabs && *abserr > errbnd)
    *ier = 2;
  if (*limit == 1)
    *ier = 1;
  if (*ier != 0 || (*abserr <= errbnd && *abserr != resabs)
      || *abserr == 0.) goto L140;

  /*           initialization */
  /*           -------------- */

  rlist2[0] = *result;
  errmax = *abserr;
  maxerr = 1;
  area = *result;
  errsum = *abserr;
  *abserr = oflow;
  nrmax = 1;
  nres = 0;
  numrl2 = 2;
  ktmin = 0;
  extrap = FALSE;
  noext = FALSE;
  iroff1 = 0;
  iroff2 = 0;
  iroff3 = 0;
  ksgn = -1;
  if (dres >= (1. - epmach * 50.) * defabs) {
    ksgn = 1;
  }

  /*           main do-loop */
  /*           ------------ */

  for (*last = 2; *last <= *limit; ++(*last)) {

    /*           bisect the subinterval with the nrmax-th largest error estimate. */

    a1 = alist__[maxerr];
    b1 = (alist__[maxerr] + blist[maxerr]) * .5;
    a2 = b1;
    b2 = blist[maxerr];
    erlast = errmax;
    rdqk21(f, ex, &a1, &b1, &area1, &error1, &resabs, &defab1);
    rdqk21(f, ex, &a2, &b2, &area2, &error2, &resabs, &defab2);

    /*           improve previous approximations to integral
		 and error and test for accuracy. */

    area12 = area1 + area2;
    erro12 = error1 + error2;
    errsum = errsum + erro12 - errmax;
    area = area + area12 - rlist[maxerr];
    if (defab1 == error1 || defab2 == error2) {
      goto L15;
    }
    if (fabs(rlist[maxerr] - area12) > fabs(area12) * 1e-5 ||
	erro12 < errmax * .99) {
      goto L10;
    }
    if (extrap) {
      ++iroff2;
    }
    if (! extrap) {
      ++iroff1;
    }
  L10:
    if (*last > 10 && erro12 > errmax) {
      ++iroff3;
    }
  L15:
    rlist[maxerr] = area1;
    rlist[*last] = area2;
    errbnd = m_max(*epsabs, *epsrel * fabs(area));

    /*           test for roundoff error and eventually set error flag. */

    if (iroff1 + iroff2 >= 10 || iroff3 >= 20)
      *ier = 2;
    if (iroff2 >= 5)
      ierro = 3;

    /* set error flag in the case that the number of subintervals equals limit. */
    if (*last == *limit)
      *ier = 1;

    /*           set error flag in the case of bad integrand behaviour
		 at a point of the integration range. */

    if (m_max(fabs(a1), fabs(b2)) <=
	(epmach * 100. + 1.) * (fabs(a2) + uflow * 1e3)) {
      *ier = 4;
    }

    /*           append the newly-created intervals to the list. */

    if (error2 > error1) {
      alist__[maxerr] = a2;
      alist__[*last] = a1;
      blist[*last] = b1;
      rlist[maxerr] = area2;
      rlist[*last] = area1;
      elist[maxerr] = error2;
      elist[*last] = error1;
    } else {
      alist__[*last] = a2;
      blist[maxerr] = b1;
      blist[*last] = b2;
      elist[maxerr] = error1;
      elist[*last] = error2;
    }

    /*           call subroutine dqpsrt to maintain the descending ordering
		 in the list of error estimates and select the subinterval
		 with nrmax-th largest error estimate (to be bisected next). */

    /*L30:*/
    rdqpsrt(limit, last, &maxerr, &errmax, &elist[1], &iord[1], &nrmax);

    if (errsum <= errbnd)   goto L115;/* ***jump out of do-loop */
    if (*ier != 0)	    goto L100;/* ***jump out of do-loop */

    if (*last == 2)	    goto L80;
    if (noext)		    goto L90;

    erlarg -= erlast;
    if (fabs(b1 - a1) > small) {
      erlarg += erro12;
    }
    if (extrap) {
      goto L40;
    }

    /*           test whether the interval to be bisected next is the
		 smallest interval. */

    if (fabs(blist[maxerr] - alist__[maxerr]) > small) {
      goto L90;
    }
    extrap = TRUE;
    nrmax = 2;
  L40:
    if (ierro == 3 || erlarg <= ertest) {
      goto L60;
    }

    /*           the smallest interval has the largest error.
		 before bisecting decrease the sum of the errors over the
		 larger intervals (erlarg) and perform extrapolation. */

    id = nrmax;
    jupbnd = *last;
    if (*last > *limit / 2 + 2) {
      jupbnd = *limit + 3 - *last;
    }
    for (k = id; k <= jupbnd; ++k) {
      maxerr = iord[nrmax];
      errmax = elist[maxerr];
      if (fabs(blist[maxerr] - alist__[maxerr]) > small) {
	goto L90;/* ***jump out of do-loop */
      }
      ++nrmax;
      /* L50: */
    }

    /*           perform extrapolation. */

  L60:
    ++numrl2;
    rlist2[numrl2 - 1] = area;
    rdqelg(&numrl2, rlist2, &reseps, &abseps, res3la, &nres);
    ++ktmin;
    if (ktmin > 5 && *abserr < errsum * .001) {
      *ier = 5;
    }
    if (abseps >= *abserr) {
      goto L70;
    }
    ktmin = 0;
    *abserr = abseps;
    *result = reseps;
    correc = erlarg;
    ertest = m_max(*epsabs, *epsrel * fabs(reseps));
    if (*abserr <= ertest) {
      goto L100;/* ***jump out of do-loop */
    }

    /*           prepare bisection of the smallest interval. */

  L70:
    if (numrl2 == 1) {
      noext = TRUE;
    }
    if (*ier == 5) {
      goto L100;
    }
    maxerr = iord[1];
    errmax = elist[maxerr];
    nrmax = 1;
    extrap = FALSE;
    small *= .5;
    erlarg = errsum;
    goto L90;
  L80:
    small = fabs(*b - *a) * .375;
    erlarg = errsum;
    ertest = errbnd;
    rlist2[1] = area;
  L90:
    ;
  }


 L100:/*		set final result and error estimate. */
      /*		------------------------------------ */
  if (*abserr == oflow) 	goto L115;
  if (*ier + ierro == 0) 	goto L110;
  if (ierro == 3)
    *abserr += correc;
  if (*ier == 0)
    *ier = 3;
  if (*result != 0. && area != 0.) goto L105;
  if (*abserr > errsum) 	goto L115;
  if (area == 0.) 		goto L130;
  goto L110;

 L105:
  if (*abserr / fabs(*result) > errsum / fabs(area)) {
    goto L115;
  }

 L110:/*		test on divergence. */
  if (ksgn == -1 && m_max(fabs(*result), fabs(area)) <= defabs * .01) {
    goto L130;
  }
  if (.01 > *result / area || *result / area > 100. || errsum > fabs(area)) {
    *ier = 5;
  }
  goto L130;

 L115:/*		compute global integral sum. */
  *result = 0.;
  for (k = 1; k <= *last; ++k)
    *result += rlist[k];
  *abserr = errsum;
 L130:
  if (*ier > 2)
  L140:
    *neval = *last * 42 - 21;

  return;
}